

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O3

bool __thiscall
libtorrent::peer_list::update_peer_port
          (peer_list *this,int port,torrent_peer *p,peer_source_flags_t src,torrent_state *state)

{
  uint uVar1;
  torrent_peer *ptVar2;
  peer_connection_interface *ppVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  match_peer_endpoint __pred;
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  i;
  address addr;
  pair<std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>,_std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>_>
  range;
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  local_128;
  address local_108;
  error_code local_e8;
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  local_d8;
  _Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>
  local_b8;
  iterator local_98;
  pair<std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>,_std::_Deque_iterator<libtorrent::torrent_peer_*,_libtorrent::torrent_peer_*&,_libtorrent::torrent_peer_**>_>
  local_78;
  
  if ((uint)p->port != port) {
    if (state->allow_multiple_connections_per_ip == true) {
      torrent_peer::address(p);
      find_peers(&local_78,this,&local_108);
      local_b8._M_cur = local_78.first._M_cur;
      local_b8._M_first = local_78.first._M_first;
      local_b8._M_last = local_78.first._M_last;
      local_b8._M_node = local_78.first._M_node;
      local_d8._M_cur = local_78.second._M_cur;
      local_d8._M_first = local_78.second._M_first;
      local_d8._M_last = local_78.second._M_last;
      local_d8._M_node = local_78.second._M_node;
      __pred._8_4_ = port;
      __pred.m_addr = &local_108;
      __pred._12_4_ = 0;
      std::
      find_if<std::_Deque_iterator<libtorrent::torrent_peer*,libtorrent::torrent_peer*&,libtorrent::torrent_peer**>,(anonymous_namespace)::match_peer_endpoint>
                (&local_128,&local_b8,&local_d8,__pred);
      if (local_128._M_cur != local_78.second._M_cur) {
        ptVar2 = *local_128._M_cur;
        if (ptVar2->connection != (peer_connection_interface *)0x0) {
          *(uint *)&ptVar2->field_0x1b =
               (src.m_val & 0x3f) << 0x10 | *(uint *)&ptVar2->field_0x1b | 0x20;
          this->m_locked_peer = p;
          ppVar3 = p->connection;
          local_e8 = errors::make_error_code(duplicate_peer_id);
          (*ppVar3->_vptr_peer_connection_interface[2])(ppVar3,&local_e8,1,0);
          this->m_locked_peer = (torrent_peer *)0x0;
          erase_peer(this,p,state);
          return false;
        }
        local_98._M_cur = local_128._M_cur;
        local_98._M_first = local_128._M_first;
        local_98._M_last = local_128._M_last;
        local_98._M_node = local_128._M_node;
        erase_peer(this,&local_98,state);
      }
    }
    uVar1 = *(uint *)&p->field_0x1b;
    if (((uVar1 & 0x44000020) == 0x20 && p->connection == (peer_connection_interface *)0x0) &&
       ((-1 < (char)uVar1 || (-1 < *(int *)&this->field_0x60)))) {
      bVar5 = (int)(uVar1 & 0x1f) < this->m_max_failcount;
    }
    else {
      bVar5 = false;
    }
    p->port = (uint16_t)port;
    *(uint *)&p->field_0x1b = (src.m_val & 0x3f) << 0x10 | uVar1 | 0x20;
    if (((p->connection == (peer_connection_interface *)0x0) &&
        ((uVar1 & 0x44000020 | 0x20) == 0x20)) &&
       ((-1 < (char)uVar1 || (-1 < *(int *)&this->field_0x60)))) {
      if (bVar5 == (int)(uVar1 & 0x1f) < this->m_max_failcount) {
        return true;
      }
    }
    else if (bVar5 == false) {
      return true;
    }
    iVar4 = (-(uint)bVar5 | 1) + this->m_num_connect_candidates;
    iVar6 = 0;
    if (0 < iVar4) {
      iVar6 = iVar4;
    }
    if (bVar5 == false) {
      iVar6 = iVar4;
    }
    this->m_num_connect_candidates = iVar6;
  }
  return true;
}

Assistant:

bool peer_list::update_peer_port(int const port, torrent_peer* p
		, peer_source_flags_t const src, torrent_state* state)
	{
		TORRENT_ASSERT(p != nullptr);
		TORRENT_ASSERT(p->connection);
		TORRENT_ASSERT(p->in_use);
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		if (p->port == port) return true;

		if (state->allow_multiple_connections_per_ip)
		{
			auto const addr = p->address();
			auto const range = find_peers(addr);
			auto const i = std::find_if(range.first, range.second
				, match_peer_endpoint(addr, std::uint16_t(port)));
			if (i != range.second)
			{
				torrent_peer& pp = **i;
				TORRENT_ASSERT(pp.in_use);
				if (pp.connection)
				{
					bool const was_conn_cand = is_connect_candidate(pp);
					// if we already have an entry with this
					// new endpoint, disconnect this one
					pp.connectable = true;
					pp.source |= static_cast<std::uint8_t>(src);
					if (!was_conn_cand && is_connect_candidate(pp))
						update_connect_candidates(1);
					// calling disconnect() on a peer, may actually end
					// up "garbage collecting" its torrent_peer entry
					// as well, if it's considered useless (which this specific)
					// case will, since it was an incoming peer that just disconnected
					// and we allow multiple connections per IP. Because of that,
					// we need to make sure we don't let it do that, locking i
					TORRENT_ASSERT(m_locked_peer == nullptr);
					m_locked_peer = p;
					p->connection->disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
					m_locked_peer = nullptr;
					erase_peer(p, state);
					return false;
				}
				erase_peer(i, state);
			}
		}
#if TORRENT_USE_ASSERTS
		else
		{
#if TORRENT_USE_I2P
			if (!p->is_i2p_addr)
#endif
			{
				std::pair<iterator, iterator> range = find_peers(p->address());
				TORRENT_ASSERT(std::distance(range.first, range.second) == 1);
			}
		}
#endif

		bool const was_conn_cand = is_connect_candidate(*p);
		p->port = std::uint16_t(port);
		p->source |= static_cast<std::uint8_t>(src);
		p->connectable = true;

		if (was_conn_cand != is_connect_candidate(*p))
			update_connect_candidates(was_conn_cand ? -1 : 1);
		return true;
	}